

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O1

shared_ptr<SchemeObject> __thiscall SchemePromise::force(SchemePromise *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  shared_ptr<SchemeObject> sVar5;
  undefined1 local_58 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  TailContext *local_30;
  _List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
  local_28;
  
  if (*(long *)(in_RSI + 8) == 0) {
    local_28._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_28;
    local_28._M_impl._M_node._M_size = 0;
    local_28._M_impl._M_node.super__List_node_base._M_prev =
         local_28._M_impl._M_node.super__List_node_base._M_next;
    SchemeProcedure::execute
              ((ExecutionResult *)(local_58 + 0x10),*(SchemeProcedure **)(in_RSI + 0x18),
               (list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *)local_28._M_impl._M_node.super__List_node_base._M_next);
    ExecutionResult::force_value((ExecutionResult *)local_58);
    uVar4 = local_58._8_8_;
    uVar3 = local_58._0_8_;
    local_58._0_8_ = 0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
    *(undefined8 *)(in_RSI + 8) = uVar3;
    *(undefined8 *)(in_RSI + 0x10) = uVar4;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    if (local_30 != (TailContext *)0x0) {
      std::default_delete<TailContext>::operator()
                ((default_delete<TailContext> *)&local_30,local_30);
    }
    local_30 = (TailContext *)0x0;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    std::__cxx11::
    _List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
    _M_clear(&local_28);
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x20);
    *(undefined8 *)(in_RSI + 0x18) = 0;
    *(undefined8 *)(in_RSI + 0x20) = 0;
    in_RDX._M_pi = extraout_RDX;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  (this->super_SchemeObject)._vptr_SchemeObject = *(_func_int ***)(in_RSI + 8);
  peVar2 = *(element_type **)(in_RSI + 0x10);
  (this->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  if (peVar2 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&peVar2[1]._vptr_SchemeObject = *(int *)&peVar2[1]._vptr_SchemeObject + 1;
      UNLOCK();
    }
    else {
      *(int *)&peVar2[1]._vptr_SchemeObject = *(int *)&peVar2[1]._vptr_SchemeObject + 1;
    }
  }
  sVar5.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_SchemeObject;
  return (shared_ptr<SchemeObject>)
         sVar5.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemeObject> SchemePromise::force()
{
    if(!value)
    {
        value = func->execute({}).force_value();
        func.reset();
    }
    return value;
}